

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O0

void __thiscall
gimage::Image<float,_gimage::PixelTraits<float>_>::Image
          (Image<float,_gimage::PixelTraits<float>_> *this,long w,long h,int d)

{
  undefined4 *in_RDI;
  long in_stack_00000028;
  long in_stack_00000030;
  long in_stack_00000038;
  Image<float,_gimage::PixelTraits<float>_> *in_stack_00000040;
  
  *in_RDI = 0;
  *(undefined8 *)(in_RDI + 2) = 0;
  *(undefined8 *)(in_RDI + 4) = 0;
  *(undefined8 *)(in_RDI + 6) = 0;
  *(undefined8 *)(in_RDI + 8) = 0;
  *(undefined8 *)(in_RDI + 10) = 0;
  *(undefined8 *)(in_RDI + 0xc) = 0;
  setSize(in_stack_00000040,in_stack_00000038,in_stack_00000030,in_stack_00000028);
  return;
}

Assistant:

Image(long w=0, long h=0, int d=1)
    {
      depth=0;
      width=0;
      height=0;
      n=0;
      pixel=0;
      row=0;
      img=0;

      setSize(w, h, d);
    }